

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

set * __thiscall QPDFJob::getWantedJSONObjects(set *__return_storage_ptr__,QPDFJob *this)

{
  bool bVar1;
  element_type *peVar2;
  QPDFObjGen local_64 [3];
  int local_4c;
  int local_48;
  int gen;
  int obj;
  bool trailer;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *iter;
  iterator __end1;
  iterator __begin1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  QPDFJob *this_local;
  set *wanted_og;
  
  QPDFObjGen::set::set(__return_storage_ptr__);
  peVar2 = std::__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  __end1 = std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&peVar2->json_objects);
  iter = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&peVar2->json_objects);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
    _obj = std::
           _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::operator*(&__end1);
    local_48 = 0;
    local_4c = 0;
    parse_object_id(_obj,(bool *)((long)&gen + 3),&local_48,&local_4c);
    QPDFObjGen::QPDFObjGen(local_64,local_48,local_4c);
    QPDFObjGen::set::add(__return_storage_ptr__,local_64[0]);
    std::
    _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

QPDFObjGen::set
QPDFJob::getWantedJSONObjects()
{
    QPDFObjGen::set wanted_og;
    for (auto const& iter: m->json_objects) {
        bool trailer;
        int obj = 0;
        int gen = 0;
        parse_object_id(iter, trailer, obj, gen);
        wanted_og.add(QPDFObjGen(obj, gen));
    }
    return wanted_og;
}